

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O3

void nh_view_replay_finish(void)

{
  long lVar1;
  long lVar2;
  
  if (orig_windowprocs.win_raw_print != (_func_void_char_ptr *)0x0) {
    memcpy(&windowprocs,&orig_windowprocs,0x90);
  }
  program_state.viewing = 0;
  program_state.game_running = 0;
  replay_end();
  freedynamicdata();
  if (0 < cpcount) {
    lVar1 = 0x18;
    lVar2 = 0;
    do {
      free_optlist(*(nh_option_desc **)((long)(checkpoints->cpdata).tags + lVar1 + -0x58));
      mfree((memfile *)((long)(checkpoints->cpdata).tags + lVar1 + -0x50));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x1fd8;
    } while (lVar2 < cpcount);
  }
  free(checkpoints);
  checkpoints = (replay_checkpoint *)0x0;
  cpcount = 0;
  logfile = -1;
  iflags.disable_log = '\0';
  return;
}

Assistant:

void nh_view_replay_finish(void)
{
    replay_restore_windowprocs();
    program_state.viewing = FALSE;
    program_state.game_running = FALSE;
    replay_end();
    freedynamicdata();
    free_checkpoints();
    logfile = -1;
    iflags.disable_log = FALSE;
}